

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

FString __thiscall Stat_fps_accumulated::GetStats(Stat_fps_accumulated *this)

{
  char *pcVar1;
  double dVar2;
  Stat_fps_accumulated *this_local;
  FString *out;
  
  dVar2 = cycle_t::TimeMS(&FrameCycles);
  f_acc = f_acc + dVar2;
  dVar2 = cycle_t::TimeMS(&WallCycles);
  w_acc = w_acc + dVar2;
  dVar2 = cycle_t::TimeMS(&PlaneCycles);
  p_acc = p_acc + dVar2;
  dVar2 = cycle_t::TimeMS(&MaskedCycles);
  m_acc = m_acc + dVar2;
  acc_c = acc_c + 1;
  FString::FString((FString *)this);
  dVar2 = 1.0 / (double)acc_c;
  FString::Format((FString *)this,
                  "frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms  %d counts",
                  f_acc * dVar2,w_acc * dVar2,p_acc * dVar2,m_acc * dVar2);
  pcVar1 = FString::GetChars((FString *)this);
  Printf(5,"%s\n",pcVar1);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT (fps_accumulated)
{
	f_acc += FrameCycles.TimeMS();
	w_acc += WallCycles.TimeMS();
	p_acc += PlaneCycles.TimeMS();
	m_acc += MaskedCycles.TimeMS();
	acc_c++;
	FString out;
	out.Format("frame=%04.1f ms  walls=%04.1f ms  planes=%04.1f ms  masked=%04.1f ms  %d counts",
		f_acc/acc_c, w_acc/acc_c, p_acc/acc_c, m_acc/acc_c, acc_c);
	Printf(PRINT_LOG, "%s\n", out.GetChars());
	return out;
}